

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

string * __thiscall Assimp::Ogre::OgreXmlSerializer::NextNode_abi_cxx11_(OgreXmlSerializer *this)

{
  int iVar1;
  string local_30;
  
  do {
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::assign((char *)&this->m_currentNodeName);
      goto LAB_00449313;
    }
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
  } while (iVar1 != 1);
  CurrentNodeName_abi_cxx11_(&local_30,this,true);
  std::__cxx11::string::~string((string *)&local_30);
LAB_00449313:
  return &this->m_currentNodeName;
}

Assistant:

std::string &OgreXmlSerializer::NextNode()
{
    do
    {
        if (!m_reader->read())
        {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
    }
    while(m_reader->getNodeType() != irr::io::EXN_ELEMENT);

    CurrentNodeName(true);
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG"<" + m_currentNodeName + ">");
#endif
    return m_currentNodeName;
}